

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeSignedInteger
          (ParserImpl *this,int64_t *value,uint64_t max_value)

{
  bool bVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  uint64_t unsigned_value;
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"-",&local_49);
  bVar1 = TryConsume(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = ConsumeUnsignedInteger(this,(uint64_t *)&local_48,bVar1 + max_value);
  if (bVar2) {
    _Var3._M_p = -local_48._M_dataplus._M_p;
    if (!bVar1) {
      _Var3._M_p = local_48._M_dataplus._M_p;
    }
    *value = (int64_t)_Var3._M_p;
  }
  return bVar2;
}

Assistant:

bool ConsumeSignedInteger(int64_t* value, uint64_t max_value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
      // Two's complement always allows one more negative integer than
      // positive.
      ++max_value;
    }

    uint64_t unsigned_value;

    DO(ConsumeUnsignedInteger(&unsigned_value, max_value));

    if (negative) {
      if ((static_cast<uint64_t>(kint64max) + 1) == unsigned_value) {
        *value = kint64min;
      } else {
        *value = -static_cast<int64_t>(unsigned_value);
      }
    } else {
      *value = static_cast<int64_t>(unsigned_value);
    }

    return true;
  }